

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O1

void release_scaled_references(AV1_COMP *cpi)

{
  _Bool _Var1;
  int *piVar2;
  RefCntBuffer *pRVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  
  _Var1 = (cpi->refresh_frame).golden_frame;
  bVar5 = 1;
  lVar4 = 0x85a7;
  do {
    piVar2 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar4 * 8);
    if (((((lVar4 == 0x85aa) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
         (cpi->ppi->lap_enabled == 0)) &&
        (((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)))) &&
       ((cpi->ppi->use_svc == 0 && (piVar2 != (int *)0x0)))) {
      pRVar3 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
      if (piVar2[0x13c] == (pRVar3->buf).field_2.field_0.y_crop_width) {
        bVar6 = piVar2[0x13e] == (pRVar3->buf).field_3.field_0.y_crop_height;
      }
      else {
        bVar6 = false;
      }
      bVar5 = bVar6 | _Var1 & 1U;
    }
    if ((piVar2 != (int *)0x0) && ((lVar4 != 0x85aa || (bVar5 != 0)))) {
      *piVar2 = *piVar2 + -1;
      *(undefined8 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar4 * 8) = 0;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x85ae);
  return;
}

Assistant:

static inline void release_scaled_references(AV1_COMP *cpi) {
  // Scaled references should only need to be released under certain conditions:
  // if the reference will be updated, or if the scaled reference has same
  // resolution. For now only apply this to Golden for non-svc RTC mode.
  AV1_COMMON *const cm = &cpi->common;
  const bool refresh_golden = (cpi->refresh_frame.golden_frame) ? 1 : 0;
  bool release_golden = true;
  for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
    RefCntBuffer *const buf = cpi->scaled_ref_buf[i];
    const int golden_ref = (i == GOLDEN_FRAME - 1);
    if (golden_ref && is_one_pass_rt_params(cpi) && !cpi->ppi->use_svc &&
        buf != NULL) {
      const RefCntBuffer *const ref = get_ref_frame_buf(cm, GOLDEN_FRAME);
      const bool same_resoln = buf->buf.y_crop_width == ref->buf.y_crop_width &&
                               buf->buf.y_crop_height == ref->buf.y_crop_height;
      release_golden = refresh_golden || same_resoln;
    }
    if (buf != NULL && (!golden_ref || (golden_ref && release_golden))) {
      --buf->ref_count;
      cpi->scaled_ref_buf[i] = NULL;
    }
  }
}